

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<capnp::compiler::BrandedDecl> *
kj::heapArray<capnp::compiler::BrandedDecl>
          (Array<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *content,
          size_t size)

{
  undefined1 local_40 [8];
  ArrayBuilder<capnp::compiler::BrandedDecl> builder;
  size_t size_local;
  BrandedDecl *content_local;
  
  builder.disposer = (ArrayDisposer *)size;
  heapArrayBuilder<capnp::compiler::BrandedDecl>
            ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40,size);
  ArrayBuilder<capnp::compiler::BrandedDecl>::addAll<capnp::compiler::BrandedDecl*,false>
            ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40,content,
             content + (long)builder.disposer);
  ArrayBuilder<capnp::compiler::BrandedDecl>::finish
            (__return_storage_ptr__,(ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40);
  ArrayBuilder<capnp::compiler::BrandedDecl>::~ArrayBuilder
            ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(T* content, size_t size) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(size);
  builder.addAll(content, content + size);
  return builder.finish();
}